

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O1

double units::detail::power_const<double>(double val,int power)

{
  double dVar1;
  double dVar2;
  
  if (power < 2) {
    if (power < -1) {
      dVar2 = power_const<double>(val,(uint)-power >> 1);
      dVar1 = 1.0;
      if ((-power & 1U) != 0) {
        dVar1 = val;
      }
      dVar1 = 1.0 / (dVar1 * dVar2 * dVar2);
    }
    else {
      dVar1 = val;
      if ((power != 1) && (dVar1 = 1.0, power == -1)) {
        dVar1 = 1.0 / val;
      }
    }
  }
  else {
    dVar1 = power_const<double>(val,(uint)power >> 1);
    if ((power & 1U) == 0) {
      val = 1.0;
    }
    dVar1 = val * dVar1 * dVar1;
  }
  return dVar1;
}

Assistant:

constexpr X power_const(X val, int power)
    {
        return (power > 1) ? sqr_power(power_const(val, power / 2)) *
                (power % 2 == 0 ? X{1.0} : val) :
            (power < -1) ? X{1.0} /
                (sqr_power(power_const(val, (-power) / 2)) *
                 ((-power) % 2 == 0 ? X{1.0} : val)) :
                           power_const_small(val, power);
    }